

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

void __thiscall HdlcAnalyzer::SetupResults(HdlcAnalyzer *this)

{
  HdlcAnalyzerResults *this_00;
  
  this_00 = (HdlcAnalyzerResults *)operator_new(0x20);
  HdlcAnalyzerResults::HdlcAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  std::auto_ptr<HdlcAnalyzerResults>::reset(&this->mResults,this_00);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void HdlcAnalyzer::SetupResults()
{
    mResults.reset( new HdlcAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}